

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_xml.cpp
# Opt level: O2

void __thiscall Kumu::XMLElement::DeleteAttrWithName(XMLElement *this,char *name)

{
  const_iterator cVar1;
  __type _Var2;
  const_iterator __position;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (name != (char *)0x0) {
    cVar1._M_node =
         (this->m_AttrList).super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
         _M_node.super__List_node_base._M_next;
    while (__position._M_node = cVar1._M_node, (XMLElement *)__position._M_node != this) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (__position._M_node + 1),&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      cVar1._M_node = (__position._M_node)->_M_next;
      if (_Var2) {
        std::__cxx11::list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::erase
                  (&this->m_AttrList,__position);
      }
    }
    return;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_xml.cpp"
                ,0x14b,"void Kumu::XMLElement::DeleteAttrWithName(const char *)");
}

Assistant:

void
Kumu::XMLElement::DeleteAttrWithName(const char* name)
{
  assert(name);
  AttributeList::iterator i = m_AttrList.begin();

  while ( i != m_AttrList.end() )
    {
      if ( i->name == std::string(name) )
	m_AttrList.erase(i++);
      else
	++i;
    }
}